

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IndexMergeLevel(Fts5Index *p,Fts5Structure **ppStruct,int iLvl,int *pnRem)

{
  int *pRc;
  Fts5Buffer *pBuf;
  ushort uVar1;
  uint nSegment;
  int iVar2;
  u8 *pData;
  Fts5StructureSegment *pFVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Fts5Iter *pFVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *zSql;
  Fts5Data *p_00;
  uint uVar13;
  sqlite3_stmt **ppStmt;
  ulong uVar14;
  Fts5StructureLevel *pFVar15;
  int in_R8D;
  long lVar16;
  Fts5SegIter *pFVar17;
  bool bVar18;
  bool bVar19;
  Fts5Buffer buf;
  ulong local_100;
  int local_f4;
  Fts5StructureSegment *local_f0;
  Fts5Structure *local_e0;
  u8 local_cc [4];
  Fts5StructureLevel *local_c8;
  Fts5Iter *pIter;
  Fts5Buffer term;
  Fts5SegWriter writer;
  
  local_e0 = *ppStruct;
  pFVar15 = local_e0->aLevel + iLvl;
  pIter = (Fts5Iter *)0x0;
  if (pnRem == (int *)0x0) {
    local_f4 = 0;
  }
  else {
    local_f4 = *pnRem;
  }
  iVar9 = p->pConfig->eDetail;
  writer.btterm.p = (u8 *)0x0;
  writer.btterm.n = 0;
  writer.btterm.nSpace = 0;
  writer.nEmpty = 0;
  writer.nDlidx = 0;
  writer.aDlidx = (Fts5DlidxWriter *)0x0;
  writer.iPrevRowid = 0;
  writer.bFirstRowidInDoclist = '\0';
  writer.bFirstRowidInPage = '\0';
  writer.bFirstTermInPage = '\0';
  writer._75_1_ = 0;
  writer.nLeafWritten = 0;
  writer.writer.term.p = (u8 *)0x0;
  writer.writer.term.n = 0;
  writer.writer.term.nSpace = 0;
  writer.writer.pgidx.p = (u8 *)0x0;
  writer.writer.pgidx.n = 0;
  writer.writer.pgidx.nSpace = 0;
  writer.writer.buf.p = (u8 *)0x0;
  writer.writer.buf.n = 0;
  writer.writer.buf.nSpace = 0;
  writer.iBtPage = 0;
  writer._116_4_ = 0;
  writer.iSegid = 0;
  writer._4_4_ = 0;
  writer.writer.pgno = 0;
  writer.writer.iPrevPgidx = 0;
  term.p = (u8 *)0x0;
  term.n = 0;
  term.nSpace = 0;
  nSegment = pFVar15->nMerge;
  if (nSegment == 0) {
    iVar10 = fts5AllocateSegid(p,local_e0);
    if (local_e0->nLevel + -1 == iLvl) {
      fts5StructureAddLevel(&p->rc,ppStruct);
      local_e0 = *ppStruct;
    }
    iVar8 = iLvl + 1;
    fts5StructureExtendLevel(&p->rc,local_e0,iVar8,0,in_R8D);
    if (p->rc != 0) {
      return;
    }
    pFVar15 = local_e0->aLevel + iLvl;
    fts5WriteInit(p,&writer,iVar10);
    pFVar3 = local_e0->aLevel[iVar8].aSeg;
    iVar2 = local_e0->aLevel[iVar8].nSeg;
    local_f0 = pFVar3 + iVar2;
    iVar11 = iVar2 + 1;
    local_e0->aLevel[iVar8].nSeg = iVar11;
    pFVar3[iVar2].pgnoFirst = 1;
    pFVar3[iVar2].iSegid = iVar10;
    local_e0->nSegment = local_e0->nSegment + 1;
    nSegment = local_e0->aLevel[iLvl].nSeg;
    local_c8 = local_e0->aLevel + iVar8;
  }
  else {
    lVar16 = *(long *)(local_e0[1].aLevel + (long)iLvl + -1) +
             (long)*(int *)((long)&local_e0[1].aLevel[(long)iLvl + -2].aSeg + 4) * 0xc;
    local_f0 = (Fts5StructureSegment *)(lVar16 + -0xc);
    fts5WriteInit(p,&writer,local_f0->iSegid);
    writer.writer.pgno = *(int *)(lVar16 + -4) + 1;
    writer._112_8_ = writer._112_8_ & 0xffffffff00000000;
    iVar11 = *(int *)((long)&local_e0[1].aLevel[(long)iLvl + -2].aSeg + 4);
    local_c8 = (Fts5StructureLevel *)&local_e0[1].aLevel[(long)iLvl + -2].aSeg;
  }
  local_100 = (ulong)nSegment;
  bVar18 = false;
  if (iVar11 == 1) {
    bVar18 = local_e0->nLevel == iLvl + 2;
  }
  fts5MultiIterNew(p,local_e0,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,iLvl,nSegment,&pIter);
  pFVar7 = pIter;
  pRc = &p->rc;
  bVar4 = false;
  while ((*pRc == 0 && ((pFVar7->base).bEof == '\0'))) {
    uVar1 = pFVar7->aFirst[1].iFirst;
    iVar10 = pFVar7->aSeg[uVar1].term.n;
    pData = pFVar7->aSeg[uVar1].term.p;
    if ((iVar10 != term.n) ||
       ((iVar10 != 0 && (iVar8 = bcmp(pData,term.p,(long)iVar10), iVar8 != 0)))) {
      if ((pnRem != (int *)0x0) && (local_f4 < writer.nLeafWritten)) break;
      sqlite3Fts5BufferSet(pRc,&term,iVar10,pData);
      bVar4 = false;
    }
    pFVar17 = pFVar7->aSeg + uVar1;
    if ((pFVar17->nPos != 0) || ((!bVar18 && (pFVar17->bDel != '\0')))) {
      iVar8 = *pRc;
      if (iVar8 == 0 && !bVar4) {
        fts5WriteAppendTerm(p,&writer,iVar10,pData);
        iVar8 = p->rc;
        bVar4 = true;
      }
      if (iVar8 == 0) {
        lVar16 = pFVar7->aSeg[pFVar7->aFirst[1].iFirst].iRowid;
        if (p->pConfig->pgsz <= writer.writer.pgidx.n + writer.writer.buf.n) {
          fts5WriteFlushLeaf(p,&writer);
        }
        if (writer.bFirstRowidInPage == '\0') {
          bVar19 = true;
        }
        else {
          *(ushort *)writer.writer.buf.p =
               (ushort)writer.writer.buf.n << 8 | (ushort)writer.writer.buf.n >> 8;
          fts5WriteDlidxAppend(p,&writer,lVar16);
          bVar19 = writer.bFirstRowidInPage == '\0';
        }
        lVar12 = 0;
        if (bVar19) {
          lVar12 = writer.iPrevRowid;
        }
        if (writer.bFirstRowidInDoclist != '\0') {
          lVar12 = 0;
        }
        sqlite3Fts5BufferAppendVarint(pRc,&writer.writer.buf,lVar16 - lVar12);
        writer._72_8_ = writer._72_8_ & 0xffffffffffff0000;
        writer.iPrevRowid = lVar16;
      }
      if (iVar9 == 1) {
        pBuf = &writer.writer.buf;
        if ((pFVar17->bDel != '\0') &&
           (sqlite3Fts5BufferAppendVarint(pRc,pBuf,0), 0 < pFVar17->nPos)) {
          sqlite3Fts5BufferAppendVarint(pRc,pBuf,0);
        }
      }
      else {
        sqlite3Fts5BufferAppendVarint
                  (pRc,&writer.writer.buf,(ulong)pFVar17->bDel + (long)pFVar17->nPos * 2);
        fts5ChunkIterate(p,pFVar17,&writer,fts5MergeChunkCallback);
      }
    }
    fts5MultiIterNext(p,pFVar7,0,0);
  }
  fts5WriteFinish(p,&writer,&local_f0->pgnoLast);
  pFVar7 = pIter;
  if ((p->rc == 0) && ((pIter->base).bEof == '\0')) {
    buf.p = (u8 *)0x0;
    buf.n = 0;
    buf.nSpace = 0;
    pFVar17 = pIter->aSeg;
    lVar16 = 0;
    while ((lVar16 < pFVar7->nSeg && (*pRc == 0))) {
      pFVar3 = pFVar17->pSeg;
      if (pFVar3 != (Fts5StructureSegment *)0x0) {
        if (pFVar17->pLeaf == (Fts5Data *)0x0) {
          pFVar3->pgnoFirst = 0;
          pFVar3->pgnoLast = 0;
        }
        else {
          iVar9 = pFVar17->iTermLeafOffset;
          local_cc[0] = '\0';
          local_cc[1] = '\0';
          local_cc[2] = '\0';
          local_cc[3] = '\0';
          uVar14 = (ulong)(uint)pFVar3->iSegid << 0x25;
          lVar12 = (long)pFVar17->iTermLeafPgno + uVar14;
          p_00 = fts5LeafRead(p,lVar12);
          uVar5 = buf._8_8_;
          if (p_00 != (Fts5Data *)0x0) {
            if (p_00->szLeaf < iVar9) {
              *pRc = 0x10b;
            }
            else {
              buf._8_8_ = buf._8_8_ & 0xffffffff00000000;
              uVar6 = buf._8_8_;
              buf.nSpace = SUB84(uVar5,4);
              bVar18 = (uint)buf.nSpace < (uint)p_00->nn;
              buf._8_8_ = uVar6;
              if (bVar18) {
                sqlite3Fts5BufferSize(pRc,&buf,p_00->nn);
              }
              sqlite3Fts5BufferAppendBlob(pRc,&buf,4,local_cc);
              sqlite3Fts5BufferAppendVarint(pRc,&buf,(long)(pFVar17->term).n);
              sqlite3Fts5BufferAppendBlob(pRc,&buf,(pFVar17->term).n,(pFVar17->term).p);
              sqlite3Fts5BufferAppendBlob(pRc,&buf,p_00->szLeaf - iVar9,p_00->p + iVar9);
              if (*pRc == 0) {
                *(ushort *)(buf.p + 2) = (ushort)buf.n << 8 | (ushort)buf.n >> 8;
              }
              sqlite3Fts5BufferAppendVarint(pRc,&buf,4);
              iVar9 = pFVar17->iLeafPgno;
              iVar10 = pFVar17->iTermLeafPgno;
              if (((iVar9 == pFVar17->iTermLeafPgno) &&
                  (iVar10 = iVar9, pFVar17->iEndofDoclist < p_00->szLeaf)) &&
                 (pFVar17->iPgidxOff <= p_00->nn)) {
                sqlite3Fts5BufferAppendVarint
                          (pRc,&buf,(long)(buf.n + (pFVar17->iEndofDoclist - p_00->szLeaf) + -5));
                sqlite3Fts5BufferAppendBlob
                          (pRc,&buf,p_00->nn - pFVar17->iPgidxOff,p_00->p + pFVar17->iPgidxOff);
                iVar10 = pFVar17->iTermLeafPgno;
              }
              pFVar17->pSeg->pgnoFirst = iVar10;
              fts5DataDelete(p,uVar14 | 1,lVar12);
              fts5DataWrite(p,lVar12,buf.p,buf.n);
            }
            sqlite3_free(p_00);
          }
        }
      }
      lVar16 = lVar16 + 1;
      pFVar17 = pFVar17 + 1;
    }
    sqlite3Fts5BufferFree(&buf);
    pFVar15->nMerge = nSegment;
  }
  else {
    ppStmt = &p->pIdxDeleter;
    uVar14 = 0;
    if (0 < (int)nSegment) {
      uVar14 = local_100;
    }
    for (lVar16 = 0; uVar14 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
      uVar13 = *(uint *)((long)&pFVar15->aSeg->iSegid + lVar16);
      fts5DataDelete(p,(ulong)uVar13 << 0x25,((ulong)(uVar13 + 1) << 0x25) + -1);
      if (p->pIdxDeleter == (sqlite3_stmt *)0x0) {
        zSql = sqlite3_mprintf("DELETE FROM \'%q\'.\'%q_idx\' WHERE segid=?",p->pConfig->zDb,
                               p->pConfig->zName);
        fts5IndexPrepareStmt(p,ppStmt,zSql);
      }
      if (*pRc == 0) {
        sqlite3_bind_int(*ppStmt,1,uVar13);
        sqlite3_step(*ppStmt);
        iVar9 = sqlite3_reset(*ppStmt);
        *pRc = iVar9;
      }
    }
    iVar9 = pFVar15->nSeg - nSegment;
    uVar13 = nSegment;
    if (iVar9 != 0) {
      memmove(pFVar15->aSeg,pFVar15->aSeg + (int)nSegment,(long)(iVar9 * 0xc));
      uVar13 = pFVar15->nSeg;
    }
    iVar9 = local_e0->nSegment - nSegment;
    local_e0->nSegment = iVar9;
    pFVar15->nSeg = uVar13 - nSegment;
    pFVar15->nMerge = 0;
    if (local_f0->pgnoLast == 0) {
      local_c8->nSeg = local_c8->nSeg + -1;
      local_e0->nSegment = iVar9 + -1;
    }
  }
  fts5MultiIterFree(pFVar7);
  sqlite3Fts5BufferFree(&term);
  if (pnRem != (int *)0x0) {
    *pnRem = *pnRem - writer.nLeafWritten;
  }
  return;
}

Assistant:

static void fts5IndexMergeLevel(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Stucture of index */
  int iLvl,                       /* Level to read input from */
  int *pnRem                      /* Write up to this many output leaves */
){
  Fts5Structure *pStruct = *ppStruct;
  Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
  Fts5StructureLevel *pLvlOut;
  Fts5Iter *pIter = 0;       /* Iterator to read input data */
  int nRem = pnRem ? *pnRem : 0;  /* Output leaf pages left to write */
  int nInput;                     /* Number of input segments */
  Fts5SegWriter writer;           /* Writer object */
  Fts5StructureSegment *pSeg;     /* Output segment */
  Fts5Buffer term;
  int bOldest;                    /* True if the output segment is the oldest */
  int eDetail = p->pConfig->eDetail;
  const int flags = FTS5INDEX_QUERY_NOOUTPUT;
  int bTermWritten = 0;           /* True if current term already output */

  assert( iLvl<pStruct->nLevel );
  assert( pLvl->nMerge<=pLvl->nSeg );

  memset(&writer, 0, sizeof(Fts5SegWriter));
  memset(&term, 0, sizeof(Fts5Buffer));
  if( pLvl->nMerge ){
    pLvlOut = &pStruct->aLevel[iLvl+1];
    assert( pLvlOut->nSeg>0 );
    nInput = pLvl->nMerge;
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg-1];

    fts5WriteInit(p, &writer, pSeg->iSegid);
    writer.writer.pgno = pSeg->pgnoLast+1;
    writer.iBtPage = 0;
  }else{
    int iSegid = fts5AllocateSegid(p, pStruct);

    /* Extend the Fts5Structure object as required to ensure the output
    ** segment exists. */
    if( iLvl==pStruct->nLevel-1 ){
      fts5StructureAddLevel(&p->rc, ppStruct);
      pStruct = *ppStruct;
    }
    fts5StructureExtendLevel(&p->rc, pStruct, iLvl+1, 1, 0);
    if( p->rc ) return;
    pLvl = &pStruct->aLevel[iLvl];
    pLvlOut = &pStruct->aLevel[iLvl+1];

    fts5WriteInit(p, &writer, iSegid);

    /* Add the new segment to the output level */
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg];
    pLvlOut->nSeg++;
    pSeg->pgnoFirst = 1;
    pSeg->iSegid = iSegid;
    pStruct->nSegment++;

    /* Read input from all segments in the input level */
    nInput = pLvl->nSeg;
  }
  bOldest = (pLvlOut->nSeg==1 && pStruct->nLevel==iLvl+2);

  assert( iLvl>=0 );
  for(fts5MultiIterNew(p, pStruct, flags, 0, 0, 0, iLvl, nInput, &pIter);
      fts5MultiIterEof(p, pIter)==0;
      fts5MultiIterNext(p, pIter, 0, 0)
  ){
    Fts5SegIter *pSegIter = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    int nPos;                     /* position-list size field value */
    int nTerm;
    const u8 *pTerm;

    pTerm = fts5MultiIterTerm(pIter, &nTerm);
    if( nTerm!=term.n || fts5Memcmp(pTerm, term.p, nTerm) ){
      if( pnRem && writer.nLeafWritten>nRem ){
        break;
      }
      fts5BufferSet(&p->rc, &term, nTerm, pTerm);
      bTermWritten =0;
    }

    /* Check for key annihilation. */
    if( pSegIter->nPos==0 && (bOldest || pSegIter->bDel==0) ) continue;

    if( p->rc==SQLITE_OK && bTermWritten==0 ){
      /* This is a new term. Append a term to the output segment. */
      fts5WriteAppendTerm(p, &writer, nTerm, pTerm);
      bTermWritten = 1;
    }

    /* Append the rowid to the output */
    /* WRITEPOSLISTSIZE */
    fts5WriteAppendRowid(p, &writer, fts5MultiIterRowid(pIter));

    if( eDetail==FTS5_DETAIL_NONE ){
      if( pSegIter->bDel ){
        fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        if( pSegIter->nPos>0 ){
          fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        }
      }
    }else{
      /* Append the position-list data to the output */
      nPos = pSegIter->nPos*2 + pSegIter->bDel;
      fts5BufferAppendVarint(&p->rc, &writer.writer.buf, nPos);
      fts5ChunkIterate(p, pSegIter, (void*)&writer, fts5MergeChunkCallback);
    }
  }

  /* Flush the last leaf page to disk. Set the output segment b-tree height
  ** and last leaf page number at the same time.  */
  fts5WriteFinish(p, &writer, &pSeg->pgnoLast);

  if( fts5MultiIterEof(p, pIter) ){
    int i;

    /* Remove the redundant segments from the %_data table */
    for(i=0; i<nInput; i++){
      fts5DataRemoveSegment(p, pLvl->aSeg[i].iSegid);
    }

    /* Remove the redundant segments from the input level */
    if( pLvl->nSeg!=nInput ){
      int nMove = (pLvl->nSeg - nInput) * sizeof(Fts5StructureSegment);
      memmove(pLvl->aSeg, &pLvl->aSeg[nInput], nMove);
    }
    pStruct->nSegment -= nInput;
    pLvl->nSeg -= nInput;
    pLvl->nMerge = 0;
    if( pSeg->pgnoLast==0 ){
      pLvlOut->nSeg--;
      pStruct->nSegment--;
    }
  }else{
    assert( pSeg->pgnoLast>0 );
    fts5TrimSegments(p, pIter);
    pLvl->nMerge = nInput;
  }

  fts5MultiIterFree(pIter);
  fts5BufferFree(&term);
  if( pnRem ) *pnRem -= writer.nLeafWritten;
}